

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void Rule_print(Node *node)

{
  FILE *__s;
  
  __s = _stderr;
  if (node == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0x160,"void Rule_fprint(FILE *, Node *)");
  }
  if (node->type == 1) {
    fprintf(_stderr,"%s.%d =",(node->rule).name,(ulong)(uint)(node->rule).id);
    if ((node->rule).expression == (Node *)0x0) {
      fwrite(" UNDEFINED",10,1,__s);
    }
    else {
      Node_fprint((FILE *)__s,(node->rule).expression);
    }
    fwrite(" ;\n",3,1,__s);
    return;
  }
  __assert_fail("Rule == node->type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                ,0x161,"void Rule_fprint(FILE *, Node *)");
}

Assistant:

static void Rule_fprint(FILE *stream, Node *node)
{
  assert(node);
  assert(Rule == node->type);
  fprintf(stream, "%s.%d =", node->rule.name, node->rule.id);
  if (node->rule.expression)
    Node_fprint(stream, node->rule.expression);
  else
    fprintf(stream, " UNDEFINED");
  fprintf(stream, " ;\n");
}